

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

int pronoun_gender(level *lev,monst *mtmp)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  uint local_24;
  monst *mtmp_local;
  level *lev_local;
  
  if ((mtmp->data->mflags2 & 0x40000) == 0) {
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
         ((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          (((u.uprops[0x40].intrinsic != 0 ||
            ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
           (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)))))))
         ) goto LAB_00251ce1;
LAB_00251d6e:
      if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
           ((poVar3 = which_armor(mtmp,4), poVar3 != (obj *)0x0 &&
            (poVar3 = which_armor(mtmp,4), poVar3->otyp == 0x4f)))) ||
          (((((u.uprops[0x1e].intrinsic == 0 &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
              ((((u.uprops[0x19].intrinsic == 0 &&
                 ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
            (u.uprops[0x19].blocked != 0)) &&
           (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
            (iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar2)))))) &&
         (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
          (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0')))) goto LAB_00251f31;
    }
    else {
      bVar1 = worm_known(lev,mtmp);
      if (bVar1 == '\0') goto LAB_00251d6e;
LAB_00251ce1:
      if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
            (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
          (((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 ||
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)))) || (((byte)u._1052_1_ >> 5 & 1) != 0))
      goto LAB_00251d6e;
    }
    if ((((mtmp->data->mflags1 & 0x20000) == 0) && ((mtmp->data->geno & 0x1000) == 0)) &&
       ((mtmp->data->mflags2 & 0x80000) == 0)) {
      local_24 = 2;
    }
    else {
      local_24 = *(uint *)&mtmp->field_0x60 & 1;
    }
    lev_local._4_4_ = local_24;
  }
  else {
LAB_00251f31:
    lev_local._4_4_ = 2;
  }
  return lev_local._4_4_;
}

Assistant:

int pronoun_gender(const struct level *lev, struct monst *mtmp)
{
	if (is_neuter(mtmp->data) || !canspotmon(lev, mtmp)) return 2;
	return (humanoid(mtmp->data) || (mtmp->data->geno & G_UNIQ) ||
		type_is_pname(mtmp->data)) ? (int)mtmp->female : 2;
}